

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O3

void __thiscall s2polyline_alignment::Window::Window(Window *this,WarpPath *warp_path)

{
  int iVar1;
  pointer ppVar2;
  pointer pCVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  pair<int,_int> *pair;
  pointer ppVar7;
  uint uVar8;
  uint uVar9;
  WarpPath *__range1;
  S2LogMessage SStack_28;
  
  (this->strides_).
  super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->strides_).
  super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->strides_).
  super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar7 = (warp_path->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  ppVar2 = (warp_path->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (ppVar7 == ppVar2) {
    S2LogMessage::S2LogMessage
              (&SStack_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x2b,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_28.stream_,"Check failed: !warp_path.empty() ",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_28.stream_,"Cannot construct window from empty warp path.",0x2d);
  }
  else if (ppVar7->second == 0 && ppVar7->first == 0) {
    iVar6 = ppVar2[-1].first;
    uVar8 = iVar6 + 1;
    this->rows_ = uVar8;
    if (iVar6 < 0) {
      S2LogMessage::S2LogMessage
                (&SStack_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
                 ,0x2e,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_28.stream_,"Check failed: rows_ > 0 ",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_28.stream_,"Must have at least one row.",0x1b);
    }
    else {
      iVar6 = ppVar2[-1].second;
      this->cols_ = iVar6 + 1;
      if (iVar6 < 0) {
        S2LogMessage::S2LogMessage
                  (&SStack_28,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
                   ,0x30,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (SStack_28.stream_,"Check failed: cols_ > 0 ",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (SStack_28.stream_,"Must have at least one column.",0x1e);
      }
      else {
        std::
        vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
        ::resize(&this->strides_,(ulong)uVar8);
        ppVar7 = (warp_path->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        ppVar2 = (warp_path->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        if (ppVar7 == ppVar2) {
          uVar8 = 0;
          iVar6 = 0;
          iVar5 = 0;
        }
        else {
          pCVar3 = (this->strides_).
                   super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar5 = 0;
          iVar6 = 0;
          uVar9 = 0;
          do {
            uVar8 = ppVar7->first;
            if ((int)uVar9 < (int)uVar8) {
              pCVar3[uVar9].start = iVar6;
              pCVar3[uVar9].end = iVar5;
              iVar6 = ppVar7->second;
              uVar9 = uVar8;
              iVar5 = iVar6;
            }
            else {
              iVar5 = ppVar7->second;
            }
            iVar5 = iVar5 + 1;
            ppVar7 = ppVar7 + 1;
          } while (ppVar7 != ppVar2);
        }
        iVar1 = this->rows_;
        if (uVar8 == iVar1 - 1U) {
          pCVar3 = (this->strides_).
                   super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pCVar3[(long)iVar1 + -1].start = iVar6;
          pCVar3[(long)iVar1 + -1].end = iVar5;
          bVar4 = IsValid(this);
          if (bVar4) {
            return;
          }
          S2LogMessage::S2LogMessage
                    (&SStack_28,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
                     ,0x42,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (SStack_28.stream_,"Check failed: this->IsValid() ",0x1e);
          std::__ostream_insert<char,std::char_traits<char>>
                    (SStack_28.stream_,"Constructor validity check fail.",0x20);
        }
        else {
          S2LogMessage::S2LogMessage
                    (&SStack_28,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
                     ,0x40,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (SStack_28.stream_,"Check failed: (curr_row) == (rows_ - 1) ",0x28);
        }
      }
    }
  }
  else {
    S2LogMessage::S2LogMessage
              (&SStack_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x2c,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_28.stream_,"Check failed: warp_path.front() == std::make_pair(0, 0) ",0x38);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_28.stream_,"Must start at (0, 0).",0x15);
  }
  abort();
}

Assistant:

Window::Window(const WarpPath& warp_path) {
  S2_DCHECK(!warp_path.empty()) << "Cannot construct window from empty warp path.";
  S2_DCHECK(warp_path.front() == std::make_pair(0, 0)) << "Must start at (0, 0).";
  rows_ = warp_path.back().first + 1;
  S2_DCHECK(rows_ > 0) << "Must have at least one row.";
  cols_ = warp_path.back().second + 1;
  S2_DCHECK(cols_ > 0) << "Must have at least one column.";
  strides_.resize(rows_);

  int prev_row = 0;
  int curr_row = 0;
  int stride_start = 0;
  int stride_stop = 0;
  for (const auto& pair : warp_path) {
    curr_row = pair.first;
    if (curr_row > prev_row) {
      strides_[prev_row] = {stride_start, stride_stop};
      stride_start = pair.second;
      prev_row = curr_row;
    }
    stride_stop = pair.second + 1;
  }
  S2_DCHECK_EQ(curr_row, rows_ - 1);
  strides_[rows_ - 1] = {stride_start, stride_stop};
  S2_DCHECK(this->IsValid()) << "Constructor validity check fail.";
}